

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

double time_to_decode_frame(AV1_COMMON *cm,int64_t max_decode_rate)

{
  FRAME_TYPE FVar1;
  int max_frame_height;
  int max_frame_width;
  SequenceHeader *seq_params;
  int spatial_layer_dimensions_present_flag;
  int luma_samples;
  FRAME_TYPE frame_type;
  int64_t max_decode_rate_local;
  AV1_COMMON *cm_local;
  double local_8;
  
  if (cm->show_existing_frame == 0) {
    FVar1 = (cm->current_frame).frame_type;
    if ((FVar1 == '\0') || (FVar1 == '\x02')) {
      luma_samples = cm->superres_upscaled_width * cm->height;
    }
    else {
      luma_samples = cm->seq_params->max_frame_width * cm->seq_params->max_frame_height;
    }
    local_8 = (double)luma_samples / (double)max_decode_rate;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

static double time_to_decode_frame(const AV1_COMMON *const cm,
                                   int64_t max_decode_rate) {
  if (cm->show_existing_frame) return 0.0;

  const FRAME_TYPE frame_type = cm->current_frame.frame_type;
  int luma_samples = 0;
  if (frame_type == KEY_FRAME || frame_type == INTRA_ONLY_FRAME) {
    luma_samples = cm->superres_upscaled_width * cm->height;
  } else {
    const int spatial_layer_dimensions_present_flag = 0;
    if (spatial_layer_dimensions_present_flag) {
      assert(0 && "Spatial layer dimensions not supported yet.");
    } else {
      const SequenceHeader *const seq_params = cm->seq_params;
      const int max_frame_width = seq_params->max_frame_width;
      const int max_frame_height = seq_params->max_frame_height;
      luma_samples = max_frame_width * max_frame_height;
    }
  }

  return luma_samples / (double)max_decode_rate;
}